

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::_longUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  Arg *pAVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *__x;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference ppAVar7;
  void *this_00;
  reference ppAVar8;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0 [32];
  string local_1a0;
  iterator local_180;
  _List_const_iterator<TCLAP::Arg_*> local_178;
  iterator local_170;
  _List_const_iterator<TCLAP::Arg_*> local_168;
  ArgListIterator it_1;
  allocator<char> local_151;
  string local_150;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_130;
  __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_128;
  string local_120;
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_b8;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_b0;
  __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_a8;
  ArgVectorIterator it;
  undefined1 local_98 [4];
  int i;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  XorHandler xorHandler;
  undefined1 local_58 [8];
  string message;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  ostream *os_local;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xb])();
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)((long)&message.field_2 + 8),
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xe])();
  std::__cxx11::string::string((string *)local_58,(string *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xc])();
  XorHandler::XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (XorHandler *)CONCAT44(extraout_var_01,iVar3));
  __x = XorHandler::getXorList
                  ((XorHandler *)
                   &xorList.
                    super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)local_98,__x);
  for (it._M_current._4_4_ = 0; uVar4 = (ulong)it._M_current._4_4_,
      sVar5 = std::
              vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ::size((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                      *)local_98), uVar4 < sVar5; it._M_current._4_4_ = it._M_current._4_4_ + 1) {
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                           *)local_98,(long)(int)it._M_current._4_4_);
    local_b0._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar6);
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg*const*,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>::
    __normal_iterator<TCLAP::Arg**>
              ((__normal_iterator<TCLAP::Arg*const*,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>
                *)&local_a8,&local_b0);
    while( true ) {
      pvVar6 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_b8._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
      bVar2 = __gnu_cxx::operator!=(&local_a8,&local_b8);
      if (!bVar2) break;
      ppAVar7 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_a8);
      pAVar1 = *ppAVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,"val",&local_f9);
      (*pAVar1->_vptr_Arg[9])(&local_d8,pAVar1,local_f8);
      spacePrint(this,os,&local_d8,0x4b,3,3);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
      ppAVar7 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_a8);
      Arg::getDescription_abi_cxx11_(&local_120,*ppAVar7);
      spacePrint(this,os,&local_120,0x4b,5,0);
      std::__cxx11::string::~string((string *)&local_120);
      local_128 = __gnu_cxx::
                  __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                  ::operator+(&local_a8,1);
      pvVar6 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_130._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
      bVar2 = __gnu_cxx::operator!=(&local_128,&local_130);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"-- OR --",&local_151);
        spacePrint(this,os,&local_150,0x4b,9,0);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
      }
      it_1._M_node = (_List_node_base *)
                     __gnu_cxx::
                     __normal_iterator<TCLAP::Arg_*const_*,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                     ::operator++(&local_a8,0);
    }
    this_00 = (void *)std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_170._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)((long)&message.field_2 + 8))
  ;
  std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_168,&local_170);
  while( true ) {
    local_180._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                    ((long)&message.field_2 + 8));
    std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_178,&local_180);
    bVar2 = std::operator!=(&local_168,&local_178);
    if (!bVar2) break;
    ppAVar8 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_168);
    bVar2 = XorHandler::contains
                      ((XorHandler *)
                       &xorList.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppAVar8);
    if (!bVar2) {
      ppAVar8 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_168);
      pAVar1 = *ppAVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1c0,"val",&local_1c1);
      (*pAVar1->_vptr_Arg[9])(&local_1a0,pAVar1,local_1c0);
      spacePrint(this,os,&local_1a0,0x4b,3,3);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      ppAVar8 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_168);
      Arg::getDescription_abi_cxx11_(&local_1e8,*ppAVar8);
      spacePrint(this,os,&local_1e8,0x4b,5,0);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    }
    std::_List_const_iterator<TCLAP::Arg_*>::operator++(&local_168,0);
  }
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  spacePrint(this,os,(string *)local_58,0x4b,3,0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             *)local_98);
  XorHandler::~XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)((long)&message.field_2 + 8));
  return;
}

Assistant:

inline void 
StdOutput::_longUsage( CmdLineInterface& _cmd, 
					   std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string message = _cmd.getMessage();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	// first the xor 
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); 
				  it++ )
				{
					spacePrint( os, (*it)->longID(), 75, 3, 3 );
					spacePrint( os, (*it)->getDescription(), 75, 5, 0 );

					if ( it+1 != xorList[i].end() )
						spacePrint(os, "-- OR --", 75, 9, 0);
				}
			os << std::endl << std::endl;
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			{
				spacePrint( os, (*it)->longID(), 75, 3, 3 ); 
				spacePrint( os, (*it)->getDescription(), 75, 5, 0 ); 
				os << std::endl;
			}

	os << std::endl;

	spacePrint( os, message, 75, 3, 0 );
}